

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall
pbrt::SpectrumCheckerboardTexture::ToString_abi_cxx11_(SpectrumCheckerboardTexture *this)

{
  bool bVar1;
  bool bVar2;
  TaggedPointer *in_RSI;
  string *in_RDI;
  char *local_a0;
  string *args_2;
  undefined7 in_stack_ffffffffffffff80;
  byte bVar3;
  char *in_stack_ffffffffffffff88;
  string local_38 [32];
  char *local_18;
  
  args_2 = in_RDI;
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    TaggedPointer<pbrt::UVMapping,pbrt::SphericalMapping,pbrt::CylindricalMapping,pbrt::PlanarMapping>
    ::ToString_abi_cxx11_
              ((TaggedPointer<pbrt::UVMapping,_pbrt::SphericalMapping,_pbrt::CylindricalMapping,_pbrt::PlanarMapping>
                *)in_RDI);
    local_a0 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_a0 = "(nullptr)";
  }
  local_18 = local_a0;
  bVar3 = 0;
  bVar2 = pbrt::TaggedPointer::operator_cast_to_bool(in_RSI + 8);
  if (bVar2) {
    TaggedPointer<pbrt::PointTransformMapping>::ToString_abi_cxx11_
              ((TaggedPointer<pbrt::PointTransformMapping> *)in_RDI);
    bVar3 = 1;
    std::__cxx11::string::c_str();
  }
  StringPrintf<char_const*,char_const*,pbrt::SpectrumTexture_const&,pbrt::SpectrumTexture_const&>
            (in_stack_ffffffffffffff88,(char **)CONCAT17(bVar3,in_stack_ffffffffffffff80),
             (char **)in_RSI,(SpectrumTexture *)args_2,(SpectrumTexture *)in_RDI);
  if ((bVar3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_38);
  }
  return args_2;
}

Assistant:

std::string SpectrumCheckerboardTexture::ToString() const {
    return StringPrintf("[ SpectrumCheckerboardTexture map2D: %s map3D: %s "
                        "tex[0]: %s tex[1]: %s ",
                        map2D ? map2D.ToString().c_str() : "(nullptr)",
                        map3D ? map3D.ToString().c_str() : "(nullptr)", tex[0], tex[1]);
}